

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_number(string *number,unsigned_long_long H)

{
  ostream *poVar1;
  long lVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (number->_M_string_length % H == 0) {
    lVar2 = H + (H == 0);
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)number);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return;
  }
  __assert_fail("0 == nl % H",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                ,0x15,"void print_number(std::string, unsigned long long)");
}

Assistant:

void print_number(std::string number, unsigned long long int H)
{
    unsigned long long int nl = number.length();
    assert(0 == nl % H);
    unsigned long long int W = nl/H;
    for (unsigned long long int i = 0; i < H; i++)
    {
        std::cout << number.substr(i*W, W) << std::endl;
    }
}